

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_conn.cc
# Opt level: O0

lp_connection_t __thiscall CSocekt::flyd_get_connection(CSocekt *this,int isock)

{
  bool bVar1;
  reference ppfVar2;
  flyd_connection_s *this_00;
  int in_ESI;
  long in_RDI;
  lp_connection_t p_Conn;
  CMemory *p_memory;
  lp_connection_t p_Conn_1;
  MutexLockGuard lock;
  undefined4 in_stack_ffffffffffffff88;
  undefined1 ifmemset;
  int in_stack_ffffffffffffff8c;
  flyd_connection_s *in_stack_ffffffffffffff90;
  flyd_connection_s *__x;
  value_type local_8;
  
  muduo::MutexLockGuard::MutexLockGuard
            ((MutexLockGuard *)in_stack_ffffffffffffff90,
             (MutexLock *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  ifmemset = (undefined1)((uint)in_stack_ffffffffffffff88 >> 0x18);
  bVar1 = std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::empty
                    ((list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *)
                     (in_RDI + 0x90));
  if (bVar1) {
    this_00 = (flyd_connection_s *)CMemory::GetInstance();
    local_8 = (value_type)
              CMemory::AllocMemory
                        ((CMemory *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                         (bool)ifmemset);
    __x = local_8;
    flyd_connection_s::flyd_connection_s(this_00);
    flyd_connection_s::GetOneToUse(local_8);
    std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::push_back
              ((list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *)this_00,
               (value_type *)__x);
    muduo::detail::AtomicIntegerT<int>::increment((AtomicIntegerT<int> *)0x13e930);
    local_8->fd = in_ESI;
  }
  else {
    ppfVar2 = std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::front
                        ((list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *)
                         in_stack_ffffffffffffff90);
    local_8 = *ppfVar2;
    std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::pop_front
              ((list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *)
               in_stack_ffffffffffffff90);
    flyd_connection_s::GetOneToUse(in_stack_ffffffffffffff90);
    muduo::detail::AtomicIntegerT<int>::decrement((AtomicIntegerT<int> *)0x13e866);
    local_8->fd = in_ESI;
  }
  muduo::MutexLockGuard::~MutexLockGuard((MutexLockGuard *)0x13e95a);
  return local_8;
}

Assistant:

lp_connection_t CSocekt::flyd_get_connection(int isock)
{
    //因为可能有其他线程要访问m_freeconnectionList，m_connectionList
    //【比如可能有专门的释放线程要释放/或者主线程要释放】之类的，所以应该临界一下
    muduo::MutexLockGuard lock(m_connectionMutex);

     if(!m_freeconnectionList.empty())
    {
        //有空闲的，自然是从空闲的中摘取
        lp_connection_t p_Conn = m_freeconnectionList.front(); //返回第一个元素但不检查元素存在与否
        m_freeconnectionList.pop_front();                         //移除第一个元素但不返回	
        p_Conn->GetOneToUse();
        m_free_connection_n.decrement(); 
        p_Conn->fd = isock;
        return p_Conn;
    }

    //走到这里，表示没空闲的连接了，那就考虑重新创建一个连接
    CMemory *p_memory = CMemory::GetInstance();
    lp_connection_t p_Conn = (lp_connection_t)p_memory->AllocMemory(sizeof(flyd_connection_t),true);
    p_Conn = new(p_Conn) flyd_connection_t();
    p_Conn->GetOneToUse();
    m_connectionList.push_back(p_Conn); //入到总表中来，但不能入到空闲表中来，因为凡是调这个函数的，肯定是要用这个连接的
    m_total_connection_n.increment();             
    p_Conn->fd = isock;
    return p_Conn;

}